

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O0

Message * __thiscall
ki::protocol::dml::MessageModule::create_message(MessageModule *this,uint8_t message_type)

{
  MessageTemplate *this_00;
  ostream *poVar1;
  value_error *this_01;
  Message *pMVar2;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  MessageTemplate *message_template;
  uint8_t message_type_local;
  MessageModule *this_local;
  
  this_00 = get_message_template(this,message_type);
  if (this_00 == (MessageTemplate *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"No message exists with type: ");
    std::operator<<(poVar1,message_type);
    poVar1 = std::operator<<((ostream *)local_198,"(service=");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_protocol_type);
    std::operator<<(poVar1,")");
    this_01 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_01,local_1c8,DML_INVALID_MESSAGE_TYPE);
    __cxa_throw(this_01,&value_error::typeinfo,value_error::~value_error);
  }
  pMVar2 = MessageTemplate::create_message(this_00);
  return pMVar2;
}

Assistant:

Message *MessageModule::create_message(uint8_t message_type) const
	{
		auto *message_template = get_message_template(message_type);
		if (!message_template)
		{
			std::ostringstream oss;
			oss << "No message exists with type: " << message_type;
			oss << "(service=" << m_protocol_type << ")";
			throw value_error(oss.str(), value_error::DML_INVALID_MESSAGE_TYPE);
		}

		return message_template->create_message();
	}